

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
          (sysbvm_context_t *context,sysbvm_tuple_t astNode_,sysbvm_tuple_t expectedType_,
          sysbvm_tuple_t environment_)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t local_70;
  sysbvm_tuple_t local_68;
  sysbvm_tuple_t local_60;
  sysbvm_tuple_t local_58;
  undefined8 uStack_50;
  sysbvm_tuple_t local_48;
  undefined8 uStack_40;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  sysbvm_tuple_t *local_20;
  
  local_20 = &local_70;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_38._12_4_ = 0;
  local_28 = 7;
  local_70 = astNode_;
  local_68 = expectedType_;
  local_60 = environment_;
  sysbvm_stackFrame_pushRecord(&local_38);
  if (local_68 == 0) {
    local_68 = (context->roots).decayedTypeInferenceType;
  }
  local_58 = sysbvm_analysisAndEvaluationEnvironment_getExpectedType(context,local_60);
  sysbvm_analysisAndEvaluationEnvironment_setExpectedType(context,local_60,local_68);
  local_48 = sysbvm_interpreter_analyzeASTIfNeededWithEnvironment(context,local_70,local_60);
  sysbvm_analysisAndEvaluationEnvironment_setExpectedType(context,local_60,local_58);
  sysbvm_stackFrame_popRecord(&local_38);
  sVar1 = sysbvm_interpreter_applyCoercionToASTNodeIntoType(context,local_48,local_60,local_68);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(sysbvm_context_t *context, sysbvm_tuple_t astNode_, sysbvm_tuple_t expectedType_, sysbvm_tuple_t environment_)
{
    struct {
        sysbvm_tuple_t astNode;
        sysbvm_tuple_t expectedType;
        sysbvm_tuple_t environment;

        sysbvm_tuple_t oldExpectedType;
        sysbvm_tuple_t nodeType;
        sysbvm_tuple_t result;

        sysbvm_tuple_t coercionExpressionType;
    } gcFrame = {
        .astNode = astNode_,
        .expectedType = expectedType_,
        .environment = environment_
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    if(!gcFrame.expectedType)
        gcFrame.expectedType = context->roots.decayedTypeInferenceType;

    // Store the old expected type.
    gcFrame.oldExpectedType = sysbvm_analysisAndEvaluationEnvironment_getExpectedType(context, gcFrame.environment);
    sysbvm_analysisAndEvaluationEnvironment_setExpectedType(context, gcFrame.environment, gcFrame.expectedType);

    // Analyze the target node itself.
    gcFrame.result = sysbvm_interpreter_analyzeASTIfNeededWithEnvironment(context, gcFrame.astNode, gcFrame.environment);

    // Restore the old expected type.
    sysbvm_analysisAndEvaluationEnvironment_setExpectedType(context, gcFrame.environment, gcFrame.oldExpectedType);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return sysbvm_interpreter_applyCoercionToASTNodeIntoType(context, gcFrame.result, gcFrame.environment, gcFrame.expectedType);
}